

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::TriangleMIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [16];
  size_t k;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [24];
  undefined1 auVar36 [24];
  undefined1 auVar37 [24];
  int iVar38;
  ulong uVar39;
  undefined4 uVar40;
  RayK<8> *pRVar41;
  long lVar42;
  ulong uVar43;
  ulong uVar44;
  ulong *puVar45;
  NodeRef root;
  undefined1 (*pauVar46) [32];
  uint uVar47;
  bool bVar48;
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [64];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  uint uVar79;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined4 uVar89;
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d29;
  BVH *local_5d28;
  Intersectors *local_5d20;
  RayK<8> *local_5d18;
  RayQueryContext *local_5d10;
  RayK<8> *local_5d08;
  undefined8 local_5d00;
  undefined8 uStack_5cf8;
  undefined8 uStack_5cf0;
  undefined8 uStack_5ce8;
  undefined1 local_5ce0 [32];
  undefined1 local_5cc0 [32];
  undefined1 local_5ca0 [32];
  undefined1 local_5c80 [32];
  uint local_5c60;
  undefined4 uStack_5c5c;
  undefined8 uStack_5c58;
  undefined8 uStack_5c50;
  undefined8 uStack_5c48;
  undefined1 local_5c40 [32];
  undefined1 local_5c20 [32];
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined1 local_5bc0 [32];
  undefined1 local_5ba0 [32];
  undefined1 local_5b80 [32];
  undefined1 local_5b60 [32];
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined8 local_5b00;
  undefined8 uStack_5af8;
  undefined8 uStack_5af0;
  undefined8 uStack_5ae8;
  undefined8 local_5ae0;
  undefined8 uStack_5ad8;
  undefined8 uStack_5ad0;
  undefined8 uStack_5ac8;
  undefined8 local_5ac0;
  undefined8 uStack_5ab8;
  undefined8 uStack_5ab0;
  undefined8 uStack_5aa8;
  undefined8 local_5aa0;
  undefined8 uStack_5a98;
  undefined8 uStack_5a90;
  undefined8 uStack_5a88;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  undefined8 local_5a60;
  undefined8 uStack_5a58;
  undefined8 uStack_5a50;
  undefined8 uStack_5a48;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d28 = (BVH *)This->ptr;
  local_5808 = (local_5d28->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar61 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar54 = ZEXT816(0) << 0x40;
      auVar66 = vpcmpeqd_avx2(auVar61,(undefined1  [32])valid_i->field_0);
      auVar61 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar54),5);
      auVar55 = auVar66 & auVar61;
      if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar55 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar55 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar55 >> 0x7f,0) != '\0') ||
            (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar55 >> 0xbf,0) != '\0') ||
          (auVar55 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar55[0x1f] < '\0') {
        auVar61 = vandps_avx(auVar61,auVar66);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5c40._8_4_ = 0x7fffffff;
        local_5c40._0_8_ = 0x7fffffff7fffffff;
        local_5c40._12_4_ = 0x7fffffff;
        local_5c40._16_4_ = 0x7fffffff;
        local_5c40._20_4_ = 0x7fffffff;
        local_5c40._24_4_ = 0x7fffffff;
        local_5c40._28_4_ = 0x7fffffff;
        auVar90._8_4_ = 0x219392ef;
        auVar90._0_8_ = 0x219392ef219392ef;
        auVar90._12_4_ = 0x219392ef;
        auVar90._16_4_ = 0x219392ef;
        auVar90._20_4_ = 0x219392ef;
        auVar90._24_4_ = 0x219392ef;
        auVar90._28_4_ = 0x219392ef;
        auVar55 = vandps_avx(local_5c40,local_59e0);
        auVar55 = vcmpps_avx(auVar55,auVar90,1);
        auVar66 = vblendvps_avx(local_59e0,auVar90,auVar55);
        auVar55 = vandps_avx(local_5c40,local_59c0);
        auVar55 = vcmpps_avx(auVar55,auVar90,1);
        auVar67 = vblendvps_avx(local_59c0,auVar90,auVar55);
        auVar55 = vandps_avx(local_59a0,local_5c40);
        auVar55 = vcmpps_avx(auVar55,auVar90,1);
        auVar55 = vblendvps_avx(local_59a0,auVar90,auVar55);
        auVar11 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
        auVar61 = vrcpps_avx(auVar66);
        auVar80._8_4_ = 0x3f800000;
        auVar80._0_8_ = 0x3f8000003f800000;
        auVar80._12_4_ = 0x3f800000;
        auVar80._16_4_ = 0x3f800000;
        auVar80._20_4_ = 0x3f800000;
        auVar80._24_4_ = 0x3f800000;
        auVar80._28_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar66,auVar61,auVar80);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar61,auVar61);
        auVar61 = vrcpps_avx(auVar67);
        auVar16 = vfnmadd213ps_fma(auVar67,auVar61,auVar80);
        auVar66 = vrcpps_avx(auVar55);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar61,auVar61);
        auVar17 = vfnmadd213ps_fma(auVar55,auVar66,auVar80);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar66,auVar66);
        local_5980 = ZEXT1632(auVar15);
        local_5960 = ZEXT1632(auVar16);
        local_5940 = ZEXT1632(auVar17);
        local_5920 = auVar15._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar15._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar15._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar15._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar16._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar16._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar16._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar16._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar17._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar17._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar17._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar17._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar61 = vcmpps_avx(local_5980,ZEXT1632(auVar54),1);
        auVar66._8_4_ = 0x20;
        auVar66._0_8_ = 0x2000000020;
        auVar66._12_4_ = 0x20;
        auVar66._16_4_ = 0x20;
        auVar66._20_4_ = 0x20;
        auVar66._24_4_ = 0x20;
        auVar66._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar61,auVar66);
        auVar55 = ZEXT1632(auVar54);
        auVar61 = vcmpps_avx(ZEXT1632(auVar16),auVar55,5);
        auVar67._8_4_ = 0x40;
        auVar67._0_8_ = 0x4000000040;
        auVar67._12_4_ = 0x40;
        auVar67._16_4_ = 0x40;
        auVar67._20_4_ = 0x40;
        auVar67._24_4_ = 0x40;
        auVar67._28_4_ = 0x40;
        auVar72._8_4_ = 0x60;
        auVar72._0_8_ = 0x6000000060;
        auVar72._12_4_ = 0x60;
        auVar72._16_4_ = 0x60;
        auVar72._20_4_ = 0x60;
        auVar72._24_4_ = 0x60;
        auVar72._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar72,auVar67,auVar61);
        auVar61 = vcmpps_avx(ZEXT1632(auVar17),auVar55,5);
        auVar68._8_4_ = 0x80;
        auVar68._0_8_ = 0x8000000080;
        auVar68._12_4_ = 0x80;
        auVar68._16_4_ = 0x80;
        auVar68._20_4_ = 0x80;
        auVar68._24_4_ = 0x80;
        auVar68._28_4_ = 0x80;
        auVar73._8_4_ = 0xa0;
        auVar73._0_8_ = 0xa0000000a0;
        auVar73._12_4_ = 0xa0;
        auVar73._16_4_ = 0xa0;
        auVar73._20_4_ = 0xa0;
        auVar73._24_4_ = 0xa0;
        auVar73._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar73,auVar68,auVar61);
        auVar61 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar55);
        local_5c20 = vpmovsxwd_avx2(auVar11);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar92 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar61,local_5c20);
        auVar61 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar55);
        auVar55._8_4_ = 0xff800000;
        auVar55._0_8_ = 0xff800000ff800000;
        auVar55._12_4_ = 0xff800000;
        auVar55._16_4_ = 0xff800000;
        auVar55._20_4_ = 0xff800000;
        auVar55._24_4_ = 0xff800000;
        auVar55._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar55,auVar61,local_5c20);
        auVar54 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5cc0 = vpmovsxwd_avx2(auVar11 ^ auVar54);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar47 = 7;
        }
        else {
          uVar47 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        pRVar41 = ray + 0x100;
        puVar45 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar46 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        local_5d00 = mm_lookupmask_ps._16_8_;
        uStack_5cf8 = mm_lookupmask_ps._24_8_;
        uStack_5cf0 = mm_lookupmask_ps._16_8_;
        uStack_5ce8 = mm_lookupmask_ps._24_8_;
        auVar61 = vpcmpeqd_avx2(local_5c40,local_5c40);
        auVar95 = ZEXT3264(auVar61);
        local_5d08 = pRVar41;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_00601fcd:
        do {
          do {
            root.ptr = puVar45[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_006026d1;
            puVar45 = puVar45 + -1;
            pauVar46 = pauVar46 + -1;
            local_5ca0 = *pauVar46;
            auVar65 = ZEXT3264(local_5ca0);
            auVar61 = vcmpps_avx(local_5ca0,local_5840,1);
          } while ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar61 >> 0x7f,0) == '\0') &&
                     (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar61 >> 0xbf,0) == '\0') &&
                   (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar61[0x1f]);
          uVar40 = vmovmskps_avx(auVar61);
          pRVar41 = (RayK<8> *)CONCAT44((int)((ulong)pRVar41 >> 0x20),uVar40);
          local_5c60 = POPCOUNT(uVar40);
          if (uVar47 < local_5c60) {
LAB_0060200b:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_006026d1;
                local_5bc0 = local_5840;
                auVar61 = vcmpps_avx(local_5840,auVar65._0_32_,6);
                if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar61 >> 0x7f,0) == '\0') &&
                      (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar61 >> 0xbf,0) == '\0') &&
                    (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar61[0x1f]) goto LAB_00601fcd;
                uVar39 = (ulong)((uint)root.ptr & 0xf);
                auVar53 = local_5cc0;
                if (uVar39 == 8) goto LAB_0060259b;
                auVar59._0_4_ = auVar95._0_4_ ^ local_5cc0._0_4_;
                auVar59._4_4_ = auVar95._4_4_ ^ local_5cc0._4_4_;
                auVar59._8_4_ = auVar95._8_4_ ^ local_5cc0._8_4_;
                auVar59._12_4_ = auVar95._12_4_ ^ local_5cc0._12_4_;
                auVar59._16_4_ = auVar95._16_4_ ^ local_5cc0._16_4_;
                auVar59._20_4_ = auVar95._20_4_ ^ local_5cc0._20_4_;
                auVar59._24_4_ = auVar95._24_4_ ^ local_5cc0._24_4_;
                auVar59._28_4_ = auVar95._28_4_ ^ local_5cc0._28_4_;
                uStack_5c58 = *(undefined8 *)(ray + 8);
                uStack_5c50 = *(undefined8 *)(ray + 0x10);
                uStack_5c48 = *(undefined8 *)(ray + 0x18);
                local_5a60 = *(undefined8 *)(ray + 0x20);
                uStack_5a58 = *(undefined8 *)(ray + 0x28);
                uStack_5a50 = *(undefined8 *)(ray + 0x30);
                uStack_5a48 = *(undefined8 *)(ray + 0x38);
                local_5a80 = *(undefined8 *)(ray + 0x40);
                uStack_5a78 = *(undefined8 *)(ray + 0x48);
                uStack_5a70 = *(undefined8 *)(ray + 0x50);
                uStack_5a68 = *(undefined8 *)(ray + 0x58);
                uVar26 = *(undefined8 *)(ray + 0x60);
                uVar27 = *(undefined8 *)(ray + 0x68);
                uVar28 = *(undefined8 *)(ray + 0x70);
                uStack_5bc8 = *(undefined8 *)(ray + 0x78);
                pRVar1 = ray + 0xa0;
                local_5aa0 = *(undefined8 *)pRVar1;
                uStack_5a98 = *(undefined8 *)(ray + 0xa8);
                uStack_5a90 = *(undefined8 *)(ray + 0xb0);
                auVar35 = *(undefined1 (*) [24])pRVar1;
                uStack_5a88 = *(undefined8 *)(ray + 0xb8);
                pRVar2 = ray + 0xc0;
                local_5ac0 = *(undefined8 *)pRVar2;
                uStack_5ab8 = *(undefined8 *)(ray + 200);
                uStack_5ab0 = *(undefined8 *)(ray + 0xd0);
                auVar36 = *(undefined1 (*) [24])pRVar2;
                uStack_5aa8 = *(undefined8 *)(ray + 0xd8);
                pRVar3 = ray + 0x80;
                local_5ae0 = *(undefined8 *)pRVar3;
                uStack_5ad8 = *(undefined8 *)(ray + 0x88);
                uStack_5ad0 = *(undefined8 *)(ray + 0x90);
                auVar37 = *(undefined1 (*) [24])pRVar3;
                uStack_5ac8 = *(undefined8 *)(ray + 0x98);
                uVar29 = *(undefined8 *)(ray + 0x100);
                uVar30 = *(undefined8 *)(ray + 0x108);
                uVar31 = *(undefined8 *)(ray + 0x110);
                uStack_5be8 = *(undefined8 *)(ray + 0x118);
                local_5b00 = *(undefined8 *)(ray + 0x120);
                uStack_5af8 = *(undefined8 *)(ray + 0x128);
                uStack_5af0 = *(undefined8 *)(ray + 0x130);
                uStack_5ae8 = *(undefined8 *)(ray + 0x138);
                lVar42 = (root.ptr & 0xfffffffffffffff0) + 0x90;
                pRVar41 = (RayK<8> *)0x0;
                goto LAB_00602294;
              }
              pRVar41 = (RayK<8> *)(root.ptr & 0xfffffffffffffff0);
              lVar42 = 0;
              uVar39 = 8;
              auVar61 = auVar92._0_32_;
              do {
                uVar43 = *(ulong *)(pRVar41 + lVar42 * 8);
                if (uVar43 == 8) {
                  auVar65 = ZEXT3264(auVar61);
                  break;
                }
                uVar40 = *(undefined4 *)(root.ptr + 0x40 + lVar42 * 4);
                auVar58._4_4_ = uVar40;
                auVar58._0_4_ = uVar40;
                auVar58._8_4_ = uVar40;
                auVar58._12_4_ = uVar40;
                auVar58._16_4_ = uVar40;
                auVar58._20_4_ = uVar40;
                auVar58._24_4_ = uVar40;
                auVar58._28_4_ = uVar40;
                auVar32._4_4_ = fStack_591c;
                auVar32._0_4_ = local_5920;
                auVar32._8_4_ = fStack_5918;
                auVar32._12_4_ = fStack_5914;
                auVar32._16_4_ = fStack_5910;
                auVar32._20_4_ = fStack_590c;
                auVar32._24_4_ = fStack_5908;
                auVar32._28_4_ = uStack_5904;
                uVar40 = *(undefined4 *)(root.ptr + 0x80 + lVar42 * 4);
                auVar76._4_4_ = uVar40;
                auVar76._0_4_ = uVar40;
                auVar76._8_4_ = uVar40;
                auVar76._12_4_ = uVar40;
                auVar76._16_4_ = uVar40;
                auVar76._20_4_ = uVar40;
                auVar76._24_4_ = uVar40;
                auVar76._28_4_ = uVar40;
                auVar54 = vfmsub213ps_fma(auVar58,local_5980,auVar32);
                auVar33._4_4_ = fStack_58fc;
                auVar33._0_4_ = local_5900;
                auVar33._8_4_ = fStack_58f8;
                auVar33._12_4_ = fStack_58f4;
                auVar33._16_4_ = fStack_58f0;
                auVar33._20_4_ = fStack_58ec;
                auVar33._24_4_ = fStack_58e8;
                auVar33._28_4_ = uStack_58e4;
                uVar40 = *(undefined4 *)(root.ptr + 0xc0 + lVar42 * 4);
                auVar77._4_4_ = uVar40;
                auVar77._0_4_ = uVar40;
                auVar77._8_4_ = uVar40;
                auVar77._12_4_ = uVar40;
                auVar77._16_4_ = uVar40;
                auVar77._20_4_ = uVar40;
                auVar77._24_4_ = uVar40;
                auVar77._28_4_ = uVar40;
                auVar11 = vfmsub213ps_fma(auVar76,local_5960,auVar33);
                auVar34._4_4_ = fStack_58dc;
                auVar34._0_4_ = local_58e0;
                auVar34._8_4_ = fStack_58d8;
                auVar34._12_4_ = fStack_58d4;
                auVar34._16_4_ = fStack_58d0;
                auVar34._20_4_ = fStack_58cc;
                auVar34._24_4_ = fStack_58c8;
                auVar34._28_4_ = uStack_58c4;
                uVar40 = *(undefined4 *)(root.ptr + 0x60 + lVar42 * 4);
                auVar81._4_4_ = uVar40;
                auVar81._0_4_ = uVar40;
                auVar81._8_4_ = uVar40;
                auVar81._12_4_ = uVar40;
                auVar81._16_4_ = uVar40;
                auVar81._20_4_ = uVar40;
                auVar81._24_4_ = uVar40;
                auVar81._28_4_ = uVar40;
                auVar15 = vfmsub213ps_fma(auVar77,local_5940,auVar34);
                auVar16 = vfmsub213ps_fma(auVar81,local_5980,auVar32);
                uVar40 = *(undefined4 *)(root.ptr + 0xa0 + lVar42 * 4);
                auVar74._4_4_ = uVar40;
                auVar74._0_4_ = uVar40;
                auVar74._8_4_ = uVar40;
                auVar74._12_4_ = uVar40;
                auVar74._16_4_ = uVar40;
                auVar74._20_4_ = uVar40;
                auVar74._24_4_ = uVar40;
                auVar74._28_4_ = uVar40;
                auVar17 = vfmsub213ps_fma(auVar74,local_5960,auVar33);
                uVar40 = *(undefined4 *)(root.ptr + 0xe0 + lVar42 * 4);
                auVar62._4_4_ = uVar40;
                auVar62._0_4_ = uVar40;
                auVar62._8_4_ = uVar40;
                auVar62._12_4_ = uVar40;
                auVar62._16_4_ = uVar40;
                auVar62._20_4_ = uVar40;
                auVar62._24_4_ = uVar40;
                auVar62._28_4_ = uVar40;
                auVar12 = vfmsub213ps_fma(auVar62,local_5940,auVar34);
                auVar55 = vpminsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar16));
                auVar66 = vpminsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar17));
                auVar55 = vpmaxsd_avx2(auVar55,auVar66);
                auVar66 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar12));
                auVar66 = vpmaxsd_avx2(auVar55,auVar66);
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar54),ZEXT1632(auVar16));
                auVar67 = vpmaxsd_avx2(ZEXT1632(auVar11),ZEXT1632(auVar17));
                auVar67 = vpminsd_avx2(auVar55,auVar67);
                auVar55 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar12));
                auVar67 = vpminsd_avx2(auVar67,auVar55);
                auVar55 = vpmaxsd_avx2(auVar66,local_5860);
                auVar67 = vpminsd_avx2(auVar67,local_5840);
                auVar55 = vcmpps_avx(auVar55,auVar67,2);
                if ((((((((auVar55 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar55 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar55 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar55 >> 0x7f,0) == '\0') &&
                      (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar55 >> 0xbf,0) == '\0') &&
                    (auVar55 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar55[0x1f]) {
                  auVar65 = ZEXT3264(auVar61);
                  uVar43 = uVar39;
                }
                else {
                  auVar55 = vblendvps_avx(auVar92._0_32_,auVar66,auVar55);
                  auVar65 = ZEXT3264(auVar55);
                  if (uVar39 != 8) {
                    *puVar45 = uVar39;
                    puVar45 = puVar45 + 1;
                    *pauVar46 = auVar61;
                    pauVar46 = pauVar46 + 1;
                  }
                }
                uVar39 = uVar43;
                lVar42 = lVar42 + 1;
                auVar61 = auVar65._0_32_;
              } while (lVar42 != 8);
              if (uVar39 == 8) goto LAB_0060218b;
              auVar61 = vcmpps_avx(local_5840,auVar65._0_32_,6);
              uVar40 = vmovmskps_avx(auVar61);
              root.ptr = uVar39;
            } while ((byte)uVar47 < (byte)POPCOUNT(uVar40));
            *puVar45 = uVar39;
            puVar45 = puVar45 + 1;
            *pauVar46 = auVar65._0_32_;
            pauVar46 = pauVar46 + 1;
LAB_0060218b:
            iVar38 = 4;
            pRVar1 = pRVar41;
          }
          else {
            uStack_5c5c = 0;
            while (pRVar41 != (RayK<8> *)0x0) {
              local_5ce0._0_8_ = pRVar41;
              k = 0;
              for (; ((ulong)pRVar41 & 1) == 0;
                  pRVar41 = (RayK<8> *)((ulong)pRVar41 >> 1 | 0x8000000000000000)) {
                k = k + 1;
              }
              local_5c80._0_8_ = k;
              auVar61 = ZEXT1632(auVar95._0_16_);
              local_5d20 = This;
              local_5d18 = ray;
              local_5d10 = context;
              bVar48 = occluded1(This,local_5d28,root,k,&local_5d29,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar48) {
                *(undefined4 *)(local_5cc0 + local_5c80._0_8_ * 4) = 0xffffffff;
              }
              pRVar41 = (RayK<8> *)(local_5ce0._0_8_ - 1 & local_5ce0._0_8_);
              auVar92 = ZEXT3264(CONCAT428(0x7f800000,
                                           CONCAT424(0x7f800000,
                                                     CONCAT420(0x7f800000,
                                                               CONCAT416(0x7f800000,
                                                                         CONCAT412(0x7f800000,
                                                                                   CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar61 = vpcmpeqd_avx2(auVar61,auVar61);
              auVar95 = ZEXT3264(auVar61);
              auVar65 = ZEXT3264(local_5ca0);
              This = local_5d20;
              ray = local_5d18;
              context = local_5d10;
            }
            auVar61 = auVar95._0_32_ & ~local_5cc0;
            iVar38 = 3;
            if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar61 >> 0x7f,0) != '\0') ||
                  (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar61 >> 0xbf,0) != '\0') ||
                (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar61[0x1f] < '\0') {
              auVar61._8_4_ = 0xff800000;
              auVar61._0_8_ = 0xff800000ff800000;
              auVar61._12_4_ = 0xff800000;
              auVar61._16_4_ = 0xff800000;
              auVar61._20_4_ = 0xff800000;
              auVar61._24_4_ = 0xff800000;
              auVar61._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar61,local_5cc0);
              iVar38 = 2;
            }
            pRVar41 = (RayK<8> *)0x0;
            pRVar1 = (RayK<8> *)0x0;
            if (uVar47 < local_5c60) goto LAB_0060200b;
          }
          pRVar41 = pRVar1;
        } while (iVar38 != 3);
LAB_006026d1:
        auVar61 = vandps_avx(local_5c20,local_5cc0);
        auVar57._8_4_ = 0xff800000;
        auVar57._0_8_ = 0xff800000ff800000;
        auVar57._12_4_ = 0xff800000;
        auVar57._16_4_ = 0xff800000;
        auVar57._20_4_ = 0xff800000;
        auVar57._24_4_ = 0xff800000;
        auVar57._28_4_ = 0xff800000;
        auVar61 = vmaskmovps_avx(auVar61,auVar57);
        *(undefined1 (*) [32])local_5d08 = auVar61;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    pRVar41 = pRVar41 + 1;
    lVar42 = lVar42 + 0xb0;
    if ((RayK<8> *)(uVar39 - 8) <= pRVar41) break;
LAB_00602294:
    local_5c80 = auVar59;
    uVar43 = 0;
    auVar61 = local_5c80;
    while (auVar55 = auVar61, uVar44 = (ulong)*(uint *)(lVar42 + uVar43 * 4), auVar61 = auVar55,
          uVar44 != 0xffffffff) {
      uVar40 = *(undefined4 *)(lVar42 + -0x90 + uVar43 * 4);
      auVar49._4_4_ = uVar40;
      auVar49._0_4_ = uVar40;
      auVar49._8_4_ = uVar40;
      auVar49._12_4_ = uVar40;
      auVar49._16_4_ = uVar40;
      auVar49._20_4_ = uVar40;
      auVar49._24_4_ = uVar40;
      auVar49._28_4_ = uVar40;
      local_5b60 = vsubps_avx(auVar49,*(undefined1 (*) [32])ray);
      uVar40 = *(undefined4 *)(lVar42 + -0x80 + uVar43 * 4);
      auVar50._4_4_ = uVar40;
      auVar50._0_4_ = uVar40;
      auVar50._8_4_ = uVar40;
      auVar50._12_4_ = uVar40;
      auVar50._16_4_ = uVar40;
      auVar50._20_4_ = uVar40;
      auVar50._24_4_ = uVar40;
      auVar50._28_4_ = uVar40;
      local_5b80 = vsubps_avx(auVar50,*(undefined1 (*) [32])(ray + 0x20));
      uVar40 = *(undefined4 *)(lVar42 + -0x70 + uVar43 * 4);
      auVar51._4_4_ = uVar40;
      auVar51._0_4_ = uVar40;
      auVar51._8_4_ = uVar40;
      auVar51._12_4_ = uVar40;
      auVar51._16_4_ = uVar40;
      auVar51._20_4_ = uVar40;
      auVar51._24_4_ = uVar40;
      auVar51._28_4_ = uVar40;
      local_5ba0 = vsubps_avx(auVar51,*(undefined1 (*) [32])(ray + 0x40));
      fVar4 = *(float *)(lVar42 + -0x60 + uVar43 * 4);
      local_5b20._4_4_ = fVar4;
      local_5b20._0_4_ = fVar4;
      local_5b20._8_4_ = fVar4;
      local_5b20._12_4_ = fVar4;
      local_5b20._16_4_ = fVar4;
      local_5b20._20_4_ = fVar4;
      local_5b20._24_4_ = fVar4;
      local_5b20._28_4_ = fVar4;
      fVar5 = *(float *)(lVar42 + -0x50 + uVar43 * 4);
      local_5b40._4_4_ = fVar5;
      local_5b40._0_4_ = fVar5;
      local_5b40._8_4_ = fVar5;
      local_5b40._12_4_ = fVar5;
      local_5b40._16_4_ = fVar5;
      local_5b40._20_4_ = fVar5;
      local_5b40._24_4_ = fVar5;
      local_5b40._28_4_ = fVar5;
      fVar6 = *(float *)(lVar42 + -0x40 + uVar43 * 4);
      auVar63._4_4_ = fVar6;
      auVar63._0_4_ = fVar6;
      auVar63._8_4_ = fVar6;
      auVar63._12_4_ = fVar6;
      auVar63._16_4_ = fVar6;
      auVar63._20_4_ = fVar6;
      auVar63._24_4_ = fVar6;
      auVar63._28_4_ = fVar6;
      fVar7 = *(float *)(lVar42 + -0x30 + uVar43 * 4);
      auVar69._4_4_ = fVar7;
      auVar69._0_4_ = fVar7;
      auVar69._8_4_ = fVar7;
      auVar69._12_4_ = fVar7;
      auVar69._16_4_ = fVar7;
      auVar69._20_4_ = fVar7;
      auVar69._24_4_ = fVar7;
      auVar69._28_4_ = fVar7;
      fVar8 = *(float *)(lVar42 + -0x20 + uVar43 * 4);
      auVar82._4_4_ = fVar8;
      auVar82._0_4_ = fVar8;
      auVar82._8_4_ = fVar8;
      auVar82._12_4_ = fVar8;
      auVar82._16_4_ = fVar8;
      auVar82._20_4_ = fVar8;
      auVar82._24_4_ = fVar8;
      auVar82._28_4_ = fVar8;
      fVar9 = *(float *)(lVar42 + -0x10 + uVar43 * 4);
      auVar93._4_4_ = fVar9;
      auVar93._0_4_ = fVar9;
      auVar93._8_4_ = fVar9;
      auVar93._12_4_ = fVar9;
      auVar93._16_4_ = fVar9;
      auVar93._20_4_ = fVar9;
      auVar93._24_4_ = fVar9;
      auVar93._28_4_ = fVar9;
      fVar10 = fVar9 * fVar5;
      auVar75._4_4_ = fVar10;
      auVar75._0_4_ = fVar10;
      auVar75._8_4_ = fVar10;
      auVar75._12_4_ = fVar10;
      auVar75._16_4_ = fVar10;
      auVar75._20_4_ = fVar10;
      auVar75._24_4_ = fVar10;
      auVar75._28_4_ = fVar10;
      auVar15 = vfmsub231ps_fma(auVar75,auVar82,auVar63);
      fVar7 = fVar6 * fVar7;
      auVar78._4_4_ = fVar7;
      auVar78._0_4_ = fVar7;
      auVar78._8_4_ = fVar7;
      auVar78._12_4_ = fVar7;
      auVar78._16_4_ = fVar7;
      auVar78._20_4_ = fVar7;
      auVar78._24_4_ = fVar7;
      auVar78._28_4_ = fVar7;
      auVar16 = vfmsub231ps_fma(auVar78,auVar93,local_5b20);
      fVar8 = fVar8 * fVar4;
      auVar91._4_4_ = fVar8;
      auVar91._0_4_ = fVar8;
      auVar91._8_4_ = fVar8;
      auVar91._12_4_ = fVar8;
      auVar91._16_4_ = fVar8;
      auVar91._20_4_ = fVar8;
      auVar91._24_4_ = fVar8;
      auVar91._28_4_ = fVar8;
      auVar17 = vfmsub231ps_fma(auVar91,auVar69,local_5b40);
      auVar18._4_4_ = auVar35._4_4_ * local_5ba0._4_4_;
      auVar18._0_4_ = auVar35._0_4_ * local_5ba0._0_4_;
      auVar18._8_4_ = auVar35._8_4_ * local_5ba0._8_4_;
      auVar18._12_4_ = auVar35._12_4_ * local_5ba0._12_4_;
      auVar18._16_4_ = auVar35._16_4_ * local_5ba0._16_4_;
      auVar18._20_4_ = auVar35._20_4_ * local_5ba0._20_4_;
      auVar18._24_4_ = (float)uStack_5a88 * local_5ba0._24_4_;
      auVar18._28_4_ = fVar4;
      auVar12 = vfmsub231ps_fma(auVar18,local_5b80,*(undefined1 (*) [32])pRVar2);
      auVar19._4_4_ = auVar36._4_4_ * local_5b60._4_4_;
      auVar19._0_4_ = auVar36._0_4_ * local_5b60._0_4_;
      auVar19._8_4_ = auVar36._8_4_ * local_5b60._8_4_;
      auVar19._12_4_ = auVar36._12_4_ * local_5b60._12_4_;
      auVar19._16_4_ = auVar36._16_4_ * local_5b60._16_4_;
      auVar19._20_4_ = auVar36._20_4_ * local_5b60._20_4_;
      auVar19._24_4_ = (float)uStack_5aa8 * local_5b60._24_4_;
      auVar19._28_4_ = fVar5;
      auVar13 = vfmsub231ps_fma(auVar19,local_5ba0,*(undefined1 (*) [32])pRVar3);
      auVar20._4_4_ = auVar37._4_4_ * local_5b80._4_4_;
      auVar20._0_4_ = auVar37._0_4_ * local_5b80._0_4_;
      auVar20._8_4_ = auVar37._8_4_ * local_5b80._8_4_;
      auVar20._12_4_ = auVar37._12_4_ * local_5b80._12_4_;
      auVar20._16_4_ = auVar37._16_4_ * local_5b80._16_4_;
      auVar20._20_4_ = auVar37._20_4_ * local_5b80._20_4_;
      auVar20._24_4_ = (float)uStack_5ac8 * local_5b80._24_4_;
      auVar20._28_4_ = local_5b80._28_4_;
      auVar14 = vfmsub231ps_fma(auVar20,local_5b60,*(undefined1 (*) [32])pRVar1);
      auVar21._4_4_ = auVar17._4_4_ * auVar36._4_4_;
      auVar21._0_4_ = auVar17._0_4_ * auVar36._0_4_;
      auVar21._8_4_ = auVar17._8_4_ * auVar36._8_4_;
      auVar21._12_4_ = auVar17._12_4_ * auVar36._12_4_;
      auVar21._16_4_ = auVar36._16_4_ * 0.0;
      auVar21._20_4_ = auVar36._20_4_ * 0.0;
      auVar21._24_4_ = (float)uStack_5aa8 * 0.0;
      auVar21._28_4_ = (int)((ulong)uStack_5aa8 >> 0x20);
      auVar54 = vfmadd231ps_fma(auVar21,ZEXT1632(auVar16),*(undefined1 (*) [32])pRVar1);
      auVar54 = vfmadd231ps_fma(ZEXT1632(auVar54),ZEXT1632(auVar15),*(undefined1 (*) [32])pRVar3);
      auVar22._4_4_ = fVar9 * auVar14._4_4_;
      auVar22._0_4_ = fVar9 * auVar14._0_4_;
      auVar22._8_4_ = fVar9 * auVar14._8_4_;
      auVar22._12_4_ = fVar9 * auVar14._12_4_;
      auVar22._16_4_ = fVar9 * 0.0;
      auVar22._20_4_ = fVar9 * 0.0;
      auVar22._24_4_ = fVar9 * 0.0;
      auVar22._28_4_ = fVar9;
      auVar11 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar13),auVar82);
      auVar83._8_4_ = 0x80000000;
      auVar83._0_8_ = 0x8000000080000000;
      auVar83._12_4_ = 0x80000000;
      auVar83._16_4_ = 0x80000000;
      auVar83._20_4_ = 0x80000000;
      auVar83._24_4_ = 0x80000000;
      auVar83._28_4_ = 0x80000000;
      auVar66 = vandps_avx(auVar83,ZEXT1632(auVar54));
      auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),ZEXT1632(auVar12),auVar69);
      uVar79 = auVar66._0_4_;
      auVar94._0_4_ = uVar79 ^ auVar11._0_4_;
      uVar84 = auVar66._4_4_;
      auVar94._4_4_ = uVar84 ^ auVar11._4_4_;
      uVar85 = auVar66._8_4_;
      auVar94._8_4_ = uVar85 ^ auVar11._8_4_;
      uVar86 = auVar66._12_4_;
      auVar94._12_4_ = uVar86 ^ auVar11._12_4_;
      uVar40 = auVar66._16_4_;
      auVar94._16_4_ = uVar40;
      uVar87 = auVar66._20_4_;
      auVar94._20_4_ = uVar87;
      uVar88 = auVar66._24_4_;
      auVar94._24_4_ = uVar88;
      uVar89 = auVar66._28_4_;
      auVar94._28_4_ = uVar89;
      auVar66 = vcmpps_avx(auVar94,ZEXT832(0) << 0x20,5);
      auVar67 = auVar55 & auVar66;
      auVar70._8_8_ = uStack_5cf8;
      auVar70._0_8_ = local_5d00;
      auVar70._16_8_ = uStack_5cf0;
      auVar70._24_8_ = uStack_5ce8;
      if ((((((((auVar67 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar67 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar67 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar67 >> 0x7f,0) != '\0') ||
            (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar67 >> 0xbf,0) != '\0') ||
          (auVar67 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar67[0x1f] < '\0') {
        auVar66 = vandps_avx(auVar66,auVar55);
        auVar23._4_4_ = auVar14._4_4_ * fVar6;
        auVar23._0_4_ = auVar14._0_4_ * fVar6;
        auVar23._8_4_ = auVar14._8_4_ * fVar6;
        auVar23._12_4_ = auVar14._12_4_ * fVar6;
        auVar23._16_4_ = fVar6 * 0.0;
        auVar23._20_4_ = fVar6 * 0.0;
        auVar23._24_4_ = fVar6 * 0.0;
        auVar23._28_4_ = fVar6;
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar23,local_5b40);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar12),ZEXT1632(auVar11),local_5b20);
        auVar60._0_4_ = uVar79 ^ auVar11._0_4_;
        auVar60._4_4_ = uVar84 ^ auVar11._4_4_;
        auVar60._8_4_ = uVar85 ^ auVar11._8_4_;
        auVar60._12_4_ = uVar86 ^ auVar11._12_4_;
        auVar60._16_4_ = uVar40;
        auVar60._20_4_ = uVar87;
        auVar60._24_4_ = uVar88;
        auVar60._28_4_ = uVar89;
        auVar67 = vcmpps_avx(auVar60,ZEXT832(0) << 0x20,5);
        auVar68 = auVar66 & auVar67;
        if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar68 >> 0x7f,0) != '\0') ||
              (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar68 >> 0xbf,0) != '\0') ||
            (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar68[0x1f] < '\0') {
          auVar68 = vandps_avx(ZEXT1632(auVar54),local_5c40);
          auVar66 = vandps_avx(auVar66,auVar67);
          auVar67 = vsubps_avx(auVar68,auVar94);
          auVar67 = vcmpps_avx(auVar67,auVar60,5);
          auVar72 = auVar66 & auVar67;
          if ((((((((auVar72 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar72 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar72 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar72 >> 0x7f,0) != '\0') ||
                (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar72 >> 0xbf,0) != '\0') ||
              (auVar72 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar72[0x1f] < '\0') {
            auVar67 = vandps_avx(auVar67,auVar66);
            auVar24._4_4_ = auVar17._4_4_ * local_5ba0._4_4_;
            auVar24._0_4_ = auVar17._0_4_ * local_5ba0._0_4_;
            auVar24._8_4_ = auVar17._8_4_ * local_5ba0._8_4_;
            auVar24._12_4_ = auVar17._12_4_ * local_5ba0._12_4_;
            auVar24._16_4_ = local_5ba0._16_4_ * 0.0;
            auVar24._20_4_ = local_5ba0._20_4_ * 0.0;
            auVar24._24_4_ = local_5ba0._24_4_ * 0.0;
            auVar24._28_4_ = auVar66._28_4_;
            auVar11 = vfmadd213ps_fma(local_5b80,ZEXT1632(auVar16),auVar24);
            auVar11 = vfmadd213ps_fma(local_5b60,ZEXT1632(auVar15),ZEXT1632(auVar11));
            auVar64._0_4_ = uVar79 ^ auVar11._0_4_;
            auVar64._4_4_ = uVar84 ^ auVar11._4_4_;
            auVar64._8_4_ = uVar85 ^ auVar11._8_4_;
            auVar64._12_4_ = uVar86 ^ auVar11._12_4_;
            auVar64._16_4_ = uVar40;
            auVar64._20_4_ = uVar87;
            auVar64._24_4_ = uVar88;
            auVar64._28_4_ = uVar89;
            local_5be0._0_4_ = (float)uVar26;
            local_5be0._4_4_ = (float)((ulong)uVar26 >> 0x20);
            uStack_5bd8._0_4_ = (float)uVar27;
            uStack_5bd8._4_4_ = (float)((ulong)uVar27 >> 0x20);
            uStack_5bd0._0_4_ = (float)uVar28;
            uStack_5bd0._4_4_ = (float)((ulong)uVar28 >> 0x20);
            auVar71._0_4_ = auVar68._0_4_ * (float)local_5be0;
            auVar71._4_4_ = auVar68._4_4_ * local_5be0._4_4_;
            auVar71._8_4_ = auVar68._8_4_ * (float)uStack_5bd8;
            auVar71._12_4_ = auVar68._12_4_ * uStack_5bd8._4_4_;
            auVar71._16_4_ = auVar68._16_4_ * (float)uStack_5bd0;
            auVar71._20_4_ = auVar68._20_4_ * uStack_5bd0._4_4_;
            auVar71._24_4_ = auVar68._24_4_ * (float)uStack_5bc8;
            auVar71._28_4_ = 0;
            auVar66 = vcmpps_avx(auVar71,auVar64,1);
            local_5c00._0_4_ = (float)uVar29;
            local_5c00._4_4_ = (float)((ulong)uVar29 >> 0x20);
            uStack_5bf8._0_4_ = (float)uVar30;
            uStack_5bf8._4_4_ = (float)((ulong)uVar30 >> 0x20);
            uStack_5bf0._0_4_ = (float)uVar31;
            uStack_5bf0._4_4_ = (float)((ulong)uVar31 >> 0x20);
            auVar25._4_4_ = auVar68._4_4_ * local_5c00._4_4_;
            auVar25._0_4_ = auVar68._0_4_ * (float)local_5c00;
            auVar25._8_4_ = auVar68._8_4_ * (float)uStack_5bf8;
            auVar25._12_4_ = auVar68._12_4_ * uStack_5bf8._4_4_;
            auVar25._16_4_ = auVar68._16_4_ * (float)uStack_5bf0;
            auVar25._20_4_ = auVar68._20_4_ * uStack_5bf0._4_4_;
            auVar25._24_4_ = auVar68._24_4_ * (float)uStack_5be8;
            auVar25._28_4_ = auVar68._28_4_;
            auVar68 = vcmpps_avx(auVar64,auVar25,2);
            auVar66 = vandps_avx(auVar68,auVar66);
            auVar68 = auVar67 & auVar66;
            if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar68 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar68 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar68 >> 0x7f,0) != '\0') ||
                  (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar68 >> 0xbf,0) != '\0') ||
                (auVar68 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar68[0x1f] < '\0') {
              auVar66 = vandps_avx(auVar66,auVar67);
              auVar67 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar54),4);
              auVar68 = auVar66 & auVar67;
              if ((((((((auVar68 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar68 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar68 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar68 >> 0x7f,0) == '\0') &&
                    (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar68 >> 0xbf,0) == '\0') &&
                  (auVar68 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar68[0x1f]) {
              }
              else {
                auVar70 = vandps_avx(auVar67,auVar66);
              }
            }
          }
        }
      }
      uVar79 = ((context->scene->geometries).items[uVar44].ptr)->mask;
      auVar52._4_4_ = uVar79;
      auVar52._0_4_ = uVar79;
      auVar52._8_4_ = uVar79;
      auVar52._12_4_ = uVar79;
      auVar52._16_4_ = uVar79;
      auVar52._20_4_ = uVar79;
      auVar52._24_4_ = uVar79;
      auVar52._28_4_ = uVar79;
      auVar66 = vpand_avx2(auVar52,*(undefined1 (*) [32])(ray + 0x120));
      auVar67 = vpcmpeqd_avx2(ZEXT832(0) << 0x20,auVar66);
      auVar66 = auVar70 & ~auVar67;
      if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar66 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar66 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar66 >> 0x7f,0) == '\0') &&
            (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar66 >> 0xbf,0) == '\0') &&
          (auVar66 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar66[0x1f])
      {
        auVar66 = vpcmpeqd_avx2(auVar94,auVar94);
      }
      else {
        auVar61 = vandnps_avx(auVar67,auVar70);
        auVar61 = vandnps_avx(auVar61,auVar55);
        auVar66 = vpcmpeqd_avx2(auVar94,auVar94);
      }
      auVar95 = ZEXT3264(auVar66);
      auVar92 = ZEXT3264(CONCAT428(0x7f800000,
                                   CONCAT424(0x7f800000,
                                             CONCAT420(0x7f800000,
                                                       CONCAT416(0x7f800000,
                                                                 CONCAT412(0x7f800000,
                                                                           CONCAT48(0x7f800000,
                                                                                                                                                                        
                                                  0x7f8000007f800000)))))));
      local_5ce0 = auVar55;
      if (((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              SUB321(auVar61 >> 0x7f,0) == '\0') &&
             (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            SUB321(auVar61 >> 0xbf,0) == '\0') &&
           (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar61[0x1f]
          ) || (bVar48 = 2 < uVar43, uVar43 = uVar43 + 1, bVar48)) break;
    }
    auVar59 = vandps_avx(auVar61,local_5c80);
    auVar61 = local_5c80 & auVar61;
    if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar61 >> 0x7f,0) == '\0') &&
          (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar61 >> 0xbf,0) == '\0') &&
        (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar61[0x1f])
    break;
  }
  auVar53._0_4_ = auVar95._0_4_ ^ auVar59._0_4_;
  auVar53._4_4_ = auVar95._4_4_ ^ auVar59._4_4_;
  auVar53._8_4_ = auVar95._8_4_ ^ auVar59._8_4_;
  auVar53._12_4_ = auVar95._12_4_ ^ auVar59._12_4_;
  auVar53._16_4_ = auVar95._16_4_ ^ auVar59._16_4_;
  auVar53._20_4_ = auVar95._20_4_ ^ auVar59._20_4_;
  auVar53._24_4_ = auVar95._24_4_ ^ auVar59._24_4_;
  auVar53._28_4_ = auVar95._28_4_ ^ auVar59._28_4_;
  local_5c00 = uVar29;
  uStack_5bf8 = uVar30;
  uStack_5bf0 = uVar31;
  local_5be0 = uVar26;
  uStack_5bd8 = uVar27;
  uStack_5bd0 = uVar28;
LAB_0060259b:
  local_5cc0 = vorps_avx(local_5cc0,auVar53);
  auVar61 = auVar95._0_32_ & ~local_5cc0;
  if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar61 >> 0x7f,0) == '\0') &&
        (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar61 >> 0xbf,0) == '\0') &&
      (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar61[0x1f])
  goto LAB_006026d1;
  auVar56._8_4_ = 0xff800000;
  auVar56._0_8_ = 0xff800000ff800000;
  auVar56._12_4_ = 0xff800000;
  auVar56._16_4_ = 0xff800000;
  auVar56._20_4_ = 0xff800000;
  auVar56._24_4_ = 0xff800000;
  auVar56._28_4_ = 0xff800000;
  local_5840 = vblendvps_avx(local_5840,auVar56,local_5cc0);
  goto LAB_00601fcd;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }